

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelList.hpp
# Opt level: O2

int __thiscall cali::util::ChannelList::remove(ChannelList *this,char *__filename)

{
  element_type *this_00;
  int extraout_EAX;
  ChannelList *pCVar1;
  
  pCVar1 = this;
  while( true ) {
    this_00 = (pCVar1->channel).mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    if (this_00 == (element_type *)0x0) {
      return (int)*(element_type **)__filename;
    }
    if ((((Channel *)&this_00->id)->mP).
        super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        *(element_type **)__filename) break;
    pCVar1 = (ChannelList *)&(this_00->name)._M_string_length;
  }
  if (this_00 ==
      (this->channel).mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    (this->channel).mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(this_00->name)._M_string_length;
  }
  unlink((ChannelList *)this_00,__filename);
  Channel::~Channel((Channel *)this_00);
  operator_delete(this_00,0x20);
  return extraout_EAX;
}

Assistant:

inline static void remove(ChannelList** head, cali::Channel& chn)
    {
        ChannelList* p = *head;

        while (p && p->channel != chn)
            p = p->next;

        if (p) {
            if (p == *head)
                *head = p->next;

            p->unlink();
            delete p;
        }
    }